

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bezier.cpp
# Opt level: O3

bool __thiscall
ON_Mesh::GetTightBoundingBox
          (ON_Mesh *this,ON_BoundingBox *Xtight_bbox,bool bGrowBox,
          ON_SimpleArray<ON_PlaneEquation> *Clip,ON_Xform *xform)

{
  ulong *puVar1;
  uint uVar2;
  _func_int *UNRECOVERED_JUMPTABLE;
  double dVar3;
  ON_3dPoint P_00;
  ON_3dPoint P_01;
  ON_3dPoint P_02;
  ON_3dPoint P_03;
  ON_3dPoint P_04;
  ON_3dPoint P_05;
  ON_3dPoint P_06;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  ON_MeshFace *pOVar8;
  ON_Xform *this_00;
  ON_SimpleArray<ON_PlaneEquation> *pOVar9;
  _Bit_type *ClipData;
  bool bVar10;
  int iVar11;
  uint uVar12;
  double *pdVar13;
  double *pdVar14;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  int iVar15;
  undefined7 in_register_00000011;
  ulong uVar16;
  int iVar17;
  ON_BoundingBox *pOVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  ON_Mesh *pOVar24;
  long lVar25;
  bool bVar26;
  byte bVar27;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  uint LastData;
  uint NextData;
  ON_3dPoint P;
  ON_Interval Dom;
  ON_3dPoint Next;
  ON_BoundingBox bbox;
  ON_Interval D;
  ON_SHA1_Hash hash;
  ON_3dPoint Corner [8];
  ON_SHA1 sha1;
  byte local_2f4;
  uint local_2ec;
  ON_Mesh *local_2e8;
  ON_MeshFace *local_2e0;
  uint local_2d4;
  ulong local_2d0;
  ON_3dPoint local_2c8;
  ON_BoundingBox *local_2a8;
  ON_Xform *local_2a0;
  ulong local_298;
  ulong local_290;
  ulong local_288;
  ON_Interval local_280;
  ON_SimpleArray<ON_PlaneEquation> *local_270;
  ON_3dPoint local_268;
  ulong local_248;
  long local_240;
  long local_238;
  uint local_22c;
  undefined1 local_228 [16];
  ON_BoundingBox local_218;
  ON_BoundingBoxCache *local_1e8;
  ON_3dPoint local_1e0;
  long local_1c8;
  ON_3dPoint local_1c0;
  ON_3dPoint local_1a8;
  ON_SHA1_Hash local_18c;
  vector<bool,_std::allocator<bool>_> local_178 [4];
  ON_SHA1 local_b8;
  
  local_2e8 = this;
  if ((int)CONCAT71(in_register_00000011,bGrowBox) == 0) {
LAB_003cfd21:
    dVar7 = ON_BoundingBox::EmptyBoundingBox.m_max.z;
    dVar6 = ON_BoundingBox::EmptyBoundingBox.m_max.x;
    dVar5 = ON_BoundingBox::EmptyBoundingBox.m_min.z;
    dVar4 = ON_BoundingBox::EmptyBoundingBox.m_min.y;
    dVar3 = ON_BoundingBox::EmptyBoundingBox.m_min.x;
    (Xtight_bbox->m_max).y = ON_BoundingBox::EmptyBoundingBox.m_max.y;
    (Xtight_bbox->m_max).z = dVar7;
    (Xtight_bbox->m_min).z = dVar5;
    (Xtight_bbox->m_max).x = dVar6;
    (Xtight_bbox->m_min).x = dVar3;
    (Xtight_bbox->m_min).y = dVar4;
    local_2f4 = 0;
  }
  else {
    bVar10 = ON_BoundingBox::IsNotEmpty(Xtight_bbox);
    local_2f4 = 1;
    if (!bVar10) goto LAB_003cfd21;
  }
  if (xform == (ON_Xform *)0x0) {
    local_2a0 = (ON_Xform *)0x0;
  }
  else {
    bVar10 = ON_Xform::IsIdentity(xform,0.0);
    local_2a0 = (ON_Xform *)0x0;
    if (!bVar10) {
      local_2a0 = xform;
    }
  }
  if ((local_2a0 == (ON_Xform *)0x0) && (Clip->m_count < 1)) {
    pdVar13 = ON_3dPoint::operator_cast_to_double_(&Xtight_bbox->m_min);
    pdVar14 = ON_3dPoint::operator_cast_to_double_(&Xtight_bbox->m_max);
    UNRECOVERED_JUMPTABLE = (local_2e8->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x19];
    iVar11 = (*UNRECOVERED_JUMPTABLE)
                       (local_2e8,pdVar13,pdVar14,(ulong)local_2f4,UNRECOVERED_JUMPTABLE);
    return SUB41(iVar11,0);
  }
  local_b8.m_state[2] = 0;
  local_b8.m_state[3] = 0;
  local_b8.m_state[4] = 0;
  local_b8.m_bit_count[0] = 0;
  local_b8.m_bit_count[1] = 0;
  local_b8.m_state[0] = 0;
  local_b8.m_state[1] = 0;
  local_b8.m_buffer[0x30] = '\0';
  local_b8.m_buffer[0x31] = '\0';
  local_b8.m_buffer[0x32] = '\0';
  local_b8.m_buffer[0x33] = '\0';
  local_b8.m_buffer[0x34] = '\0';
  local_b8.m_buffer[0x35] = '\0';
  local_b8.m_buffer[0x36] = '\0';
  local_b8.m_buffer[0x37] = '\0';
  local_b8.m_buffer[0x38] = '\0';
  local_b8.m_buffer[0x39] = '\0';
  local_b8.m_buffer[0x3a] = '\0';
  local_b8.m_buffer[0x3b] = '\0';
  local_b8.m_buffer[0x3c] = '\0';
  local_b8.m_buffer[0x3d] = '\0';
  local_b8.m_buffer[0x3e] = '\0';
  local_b8.m_buffer[0x3f] = '\0';
  local_b8.m_buffer[0x20] = '\0';
  local_b8.m_buffer[0x21] = '\0';
  local_b8.m_buffer[0x22] = '\0';
  local_b8.m_buffer[0x23] = '\0';
  local_b8.m_buffer[0x24] = '\0';
  local_b8.m_buffer[0x25] = '\0';
  local_b8.m_buffer[0x26] = '\0';
  local_b8.m_buffer[0x27] = '\0';
  local_b8.m_buffer[0x28] = '\0';
  local_b8.m_buffer[0x29] = '\0';
  local_b8.m_buffer[0x2a] = '\0';
  local_b8.m_buffer[0x2b] = '\0';
  local_b8.m_buffer[0x2c] = '\0';
  local_b8.m_buffer[0x2d] = '\0';
  local_b8.m_buffer[0x2e] = '\0';
  local_b8.m_buffer[0x2f] = '\0';
  local_b8.m_buffer[0x10] = '\0';
  local_b8.m_buffer[0x11] = '\0';
  local_b8.m_buffer[0x12] = '\0';
  local_b8.m_buffer[0x13] = '\0';
  local_b8.m_buffer[0x14] = '\0';
  local_b8.m_buffer[0x15] = '\0';
  local_b8.m_buffer[0x16] = '\0';
  local_b8.m_buffer[0x17] = '\0';
  local_b8.m_buffer[0x18] = '\0';
  local_b8.m_buffer[0x19] = '\0';
  local_b8.m_buffer[0x1a] = '\0';
  local_b8.m_buffer[0x1b] = '\0';
  local_b8.m_buffer[0x1c] = '\0';
  local_b8.m_buffer[0x1d] = '\0';
  local_b8.m_buffer[0x1e] = '\0';
  local_b8.m_buffer[0x1f] = '\0';
  local_b8.m_buffer[0] = '\0';
  local_b8.m_buffer[1] = '\0';
  local_b8.m_buffer[2] = '\0';
  local_b8.m_buffer[3] = '\0';
  local_b8.m_buffer[4] = '\0';
  local_b8.m_buffer[5] = '\0';
  local_b8.m_buffer[6] = '\0';
  local_b8.m_buffer[7] = '\0';
  local_b8.m_buffer[8] = '\0';
  local_b8.m_buffer[9] = '\0';
  local_b8.m_buffer[10] = '\0';
  local_b8.m_buffer[0xb] = '\0';
  local_b8.m_buffer[0xc] = '\0';
  local_b8.m_buffer[0xd] = '\0';
  local_b8.m_buffer[0xe] = '\0';
  local_b8.m_buffer[0xf] = '\0';
  local_b8.m_byte_count = 0;
  local_b8.m_status_bits = 0;
  local_b8.m_reserved = 0;
  ON_SHA1_Hash::ON_SHA1_Hash(&local_b8.m_sha1_hash);
  if (local_2a0 != (ON_Xform *)0x0) {
    ON_SHA1::AccumulateTransformation(&local_b8,local_2a0);
  }
  local_2a8 = Xtight_bbox;
  if (Clip->m_count != 0) {
    lVar21 = 0;
    uVar23 = 0;
    do {
      ON_SHA1::AccumulateDoubleArray(&local_b8,4,(double *)((long)&Clip->m_a->x + lVar21));
      uVar23 = uVar23 + 1;
      lVar21 = lVar21 + 0x20;
    } while (uVar23 < (uint)Clip->m_count);
  }
  ON_SHA1::Hash(&local_18c,&local_b8);
  ON_BoundingBox::ON_BoundingBox(&local_218);
  local_1e8 = &local_2e8->m_tight_bbox_cache;
  bVar10 = ON_BoundingBoxCache::GetBoundingBox(local_1e8,&local_18c,&local_218);
  pOVar24 = local_2e8;
  if (bVar10) {
    if (local_2f4 == 0) {
LAB_003d001e:
      (local_2a8->m_max).y = local_218.m_max.y;
      (local_2a8->m_max).z = local_218.m_max.z;
      (local_2a8->m_min).z = local_218.m_min.z;
      (local_2a8->m_max).x = local_218.m_max.x;
      *(undefined4 *)&(local_2a8->m_min).x = local_218.m_min.x._0_4_;
      *(undefined4 *)((long)&(local_2a8->m_min).x + 4) = local_218.m_min.x._4_4_;
      *(undefined4 *)&(local_2a8->m_min).y = local_218.m_min.y._0_4_;
      *(undefined4 *)((long)&(local_2a8->m_min).y + 4) = local_218.m_min.y._4_4_;
      pOVar18 = local_2a8;
    }
    else {
LAB_003cfeae:
      pOVar18 = local_2a8;
      ON_BoundingBox::Union(local_2a8,&local_218);
    }
    bVar10 = ON_BoundingBox::IsNotEmpty(pOVar18);
  }
  else {
    if (local_2a0 == (ON_Xform *)0x0) {
      pOVar18 = &local_2e8->m_vertex_bbox;
      bVar10 = ON_BoundingBox::IsNotEmpty(pOVar18);
      if (bVar10) {
        ON_BoundingBox::GetCorners(pOVar18,(ON_3dPoint *)local_178);
        iVar11 = Clip->m_count;
        bVar10 = true;
        uVar23 = 0;
        do {
          if ((bVar10) && (0 < iVar11)) {
            lVar21 = uVar23 * 0x18;
            lVar20 = 0;
            lVar25 = 1;
            do {
              P_00.y = (double)*(undefined8 *)
                                ((long)&local_178[0].super__Bvector_base<std::allocator<bool>_>.
                                        _M_impl.super__Bvector_impl_data._M_start + lVar21 + 8);
              P_00.x = (double)*(undefined8 *)
                                ((long)&local_178[0].super__Bvector_base<std::allocator<bool>_>.
                                        _M_impl.super__Bvector_impl_data._M_start + lVar21);
              P_00.z = *(double *)
                        ((long)&local_178[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_finish + lVar21);
              dVar3 = ON_PlaneEquation::ValueAt
                                ((ON_PlaneEquation *)((long)&Clip->m_a->x + lVar20),P_00);
              iVar11 = Clip->m_count;
              if (0.0 < dVar3) break;
              lVar20 = lVar20 + 0x20;
              bVar10 = lVar25 < iVar11;
              lVar25 = lVar25 + 1;
            } while (bVar10);
            bVar10 = dVar3 <= 0.0;
            pOVar24 = local_2e8;
          }
        } while ((bVar10) && (bVar26 = uVar23 < 7, uVar23 = uVar23 + 1, bVar26));
        if (bVar10) {
          pdVar13 = ON_3dPoint::operator_cast_to_double_(&local_218.m_min);
          pdVar14 = ON_3dPoint::operator_cast_to_double_(&local_218.m_max);
          iVar11 = (*(pOVar24->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x19])
                             (pOVar24,pdVar13,pdVar14,0);
          ON_BoundingBoxCache::AddBoundingBox(local_1e8,&local_218,&local_18c);
          if ((local_2f4 & (byte)iVar11) != 1) goto LAB_003d001e;
          goto LAB_003cfeae;
        }
      }
    }
    uVar12 = VertexCount(pOVar24);
    if ((int)uVar12 < 3) {
      bVar10 = false;
    }
    else {
      uVar2 = Clip->m_count;
      uVar23 = 0x20;
      if ((int)uVar2 < 0x20) {
        uVar23 = (ulong)uVar2;
      }
      local_2e0 = (ON_MeshFace *)CONCAT44(local_2e0._4_4_,uVar2);
      if ((int)uVar2 < 1) {
        iVar11 = 1;
      }
      else {
        dVar3 = log2((double)(int)((uint)(1 < (int)uVar2) + (int)uVar23));
        dVar3 = ceil(dVar3);
        iVar11 = 1 << ((byte)(int)dVar3 & 0x1f);
      }
      local_2c8.x = (double)((ulong)local_2c8.x & 0xffffffffffffff00);
      std::vector<bool,_std::allocator<bool>_>::vector
                (local_178,(long)(int)(iVar11 * uVar12),(bool *)&local_2c8,
                 (allocator_type *)&local_268);
      local_238 = (long)iVar11;
      local_2d0 = (ulong)uVar12;
      local_240 = uVar23 - 1;
      iVar17 = 2;
      uVar22 = 0;
      local_290 = 0x800000000000003f;
      iVar15 = (int)local_2e0;
      local_298 = uVar23;
      local_270 = Clip;
      local_248 = uVar23;
      do {
        ON_3dPoint::ON_3dPoint
                  (&local_2c8,(local_2e8->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a + uVar22);
        if (local_2a0 != (ON_Xform *)0x0) {
          ON_Xform::operator*(&local_268,local_2a0,&local_2c8);
          local_2c8.z = local_268.z;
          local_2c8.x = local_268.x;
          local_2c8.y = local_268.y;
        }
        if (iVar15 < 1) {
LAB_003d0373:
          ON_BoundingBox::Set(&local_218,&local_2c8,1);
        }
        else {
          P_01.y = local_2c8.y;
          P_01.x = local_2c8.x;
          P_01.z = local_2c8.z;
          dVar3 = ON_PlaneEquation::ValueAt(Clip->m_a,P_01);
          local_288 = uVar22 * local_238;
          bVar10 = 0.0 < dVar3;
          local_228._0_4_ = iVar17;
          if (1 < iVar15) {
            uVar23 = local_288 + 1;
            iVar15 = (int)uVar23;
            iVar19 = iVar15 + 0x3f;
            if (-1 < iVar15) {
              iVar19 = iVar15;
            }
            iVar19 = iVar19 >> 6;
            uVar16 = 1L << ((byte)uVar23 & 0x3f);
            lVar21 = (ulong)((uVar23 & local_290) < 0x8000000000000001) * 8 + -8;
            if (dVar3 <= 0.0) {
              uVar16 = ~uVar16 & *(ulong *)((long)local_178[0].
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_start.
                                                  super__Bit_iterator_base._M_p +
                                           lVar21 + (long)iVar19 * 8);
            }
            else {
              uVar16 = uVar16 | *(ulong *)((long)local_178[0].
                                                 super__Bvector_base<std::allocator<bool>_>._M_impl.
                                                 super__Bvector_impl_data._M_start.
                                                 super__Bit_iterator_base._M_p +
                                          lVar21 + (long)iVar19 * 8);
            }
            uVar23 = (ulong)iVar17;
            *(ulong *)((long)local_178[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                      lVar21 + (long)iVar19 * 8) = uVar16;
            lVar25 = 0x20;
            lVar21 = local_240;
            do {
              P_02.y = local_2c8.y;
              P_02.x = local_2c8.x;
              P_02.z = local_2c8.z;
              dVar3 = ON_PlaneEquation::ValueAt
                                ((ON_PlaneEquation *)((long)&local_270->m_a->x + lVar25),P_02);
              iVar15 = iVar17 + 0x3f;
              if (-1 < iVar17) {
                iVar15 = iVar17;
              }
              iVar15 = iVar15 >> 6;
              uVar16 = 1L << ((byte)uVar23 & 0x3f);
              lVar20 = (ulong)((uVar23 & local_290) < 0x8000000000000001) * 8 + -8;
              if (dVar3 <= 0.0) {
                uVar16 = ~uVar16 & *(ulong *)((long)local_178[0].
                                                    super__Bvector_base<std::allocator<bool>_>.
                                                    _M_impl.super__Bvector_impl_data._M_start.
                                                    super__Bit_iterator_base._M_p +
                                             lVar20 + (long)iVar15 * 8);
              }
              else {
                uVar16 = uVar16 | *(ulong *)((long)local_178[0].
                                                   super__Bvector_base<std::allocator<bool>_>.
                                                   _M_impl.super__Bvector_impl_data._M_start.
                                                   super__Bit_iterator_base._M_p +
                                            lVar20 + (long)iVar15 * 8);
              }
              *(ulong *)((long)local_178[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                        lVar20 + (long)iVar15 * 8) = uVar16;
              bVar10 = (bool)(bVar10 | 0.0 < dVar3);
              iVar17 = iVar17 + 1;
              lVar25 = lVar25 + 0x20;
              uVar23 = uVar23 + 1;
              lVar21 = lVar21 + -1;
            } while (lVar21 != 0);
          }
          iVar17 = (int)local_288;
          iVar19 = iVar17 + 0x3f;
          if (-1 < iVar17) {
            iVar19 = iVar17;
          }
          lVar21 = (ulong)((local_288 & local_290) < 0x8000000000000001) * 8 + -8;
          uVar23 = 1L << ((byte)local_288 & 0x3f);
          Clip = local_270;
          iVar15 = (int)local_2e0;
          iVar17 = local_228._0_4_;
          if (!bVar10) {
            puVar1 = (ulong *)((long)local_178[0].super__Bvector_base<std::allocator<bool>_>._M_impl
                                     .super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                     _M_p + lVar21 + (long)(iVar19 >> 6) * 8);
            *puVar1 = *puVar1 & ~uVar23;
            goto LAB_003d0373;
          }
          puVar1 = (ulong *)((long)local_178[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
                                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                            lVar21 + (long)(iVar19 >> 6) * 8);
          *puVar1 = *puVar1 | uVar23;
        }
        uVar22 = uVar22 + 1;
        iVar17 = iVar17 + iVar11;
      } while (uVar22 != local_2d0);
      pOVar18 = local_2a8;
      if (0 < iVar15) {
        local_22c = (int)local_298 - 1;
        local_248 = local_248 << 5;
        lVar21 = 0;
        while (pOVar18 = local_2a8, pOVar24 = local_2e8, iVar17 = FaceCount(local_2e8),
              lVar21 < iVar17) {
          local_2e0 = (pOVar24->m_F).m_a;
          local_2ec = 0;
          iVar15 = local_2e0[lVar21].vi[0] * iVar11;
          iVar17 = iVar15 + 0x3f;
          if (-1 < iVar15) {
            iVar17 = iVar15;
          }
          bVar27 = (*(ulong *)((long)local_178[0].super__Bvector_base<std::allocator<bool>_>._M_impl
                                     .super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                     _M_p +
                              (ulong)(((long)iVar15 & local_290) < 0x8000000000000001) * 8 +
                              (long)(iVar17 >> 6) * 8 + -8) & 1L << ((byte)iVar15 & 0x3f)) != 0;
          local_1c8 = lVar21;
          if ((bool)bVar27) {
            GetClipData(local_2e0[lVar21].vi[0],
                        (vector<bool,_std::allocator<bool>_> *)
                        local_178[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,&local_2ec,
                        (int)local_298,iVar11);
          }
          uVar23 = (ulong)bVar27;
          local_2e0 = local_2e0 + lVar21;
          lVar21 = 0;
          do {
            ClipData = local_178[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
            if ((lVar21 != 2) || (lVar25 = 3, local_2e0->vi[2] != local_2e0->vi[3])) {
              local_2d4 = 0;
              local_238 = lVar21 + 1;
              uVar12 = (uint)local_238 & 3;
              iVar15 = local_2e0->vi[uVar12] * iVar11;
              iVar17 = iVar15 + 0x3f;
              if (-1 < iVar15) {
                iVar17 = iVar15;
              }
              bVar10 = (*(ulong *)((long)local_178[0].super__Bvector_base<std::allocator<bool>_>.
                                         _M_impl.super__Bvector_impl_data._M_start.
                                         super__Bit_iterator_base._M_p +
                                  (ulong)(((long)iVar15 & local_290) < 0x8000000000000001) * 8 +
                                  (long)(iVar17 >> 6) * 8 + -8) & 1L << ((byte)iVar15 & 0x3f)) == 0;
              local_240 = CONCAT71(local_240._1_7_,!bVar10);
              if (bVar10) {
                local_2d0 = local_2d0 & 0xffffffff00000000;
                local_288 = local_288 & 0xffffffff00000000;
                if ((bVar27 & 1) != 0) goto LAB_003d0564;
              }
              else {
                GetClipData(local_2e0->vi[uVar12],
                            (vector<bool,_std::allocator<bool>_> *)
                            local_178[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                            &local_2d4,(int)local_298,iVar11);
                local_2d0 = CONCAT44(local_2d0._4_4_,(int)CONCAT71(extraout_var,1));
LAB_003d0564:
                pOVar8 = local_2e0;
                if ((uVar23 & 1) == 0) {
                  GetClipData(local_2e0->vi[lVar21],(vector<bool,_std::allocator<bool>_> *)ClipData,
                              &local_2ec,(int)local_298,iVar11);
                }
                if ((char)local_2d0 == '\0') {
                  GetClipData(pOVar8->vi[lVar21],(vector<bool,_std::allocator<bool>_> *)ClipData,
                              &local_2d4,(int)local_298,iVar11);
                  local_2d0 = CONCAT44(local_2d0._4_4_,(int)CONCAT71(extraout_var_00,1));
                }
                pOVar24 = local_2e8;
                uVar2 = local_2ec;
                local_288 = CONCAT44(local_288._4_4_,local_2d4);
                if ((local_2d4 & local_2ec) == 0) {
                  ON_3dPoint::ON_3dPoint
                            (&local_2c8,
                             (local_2e8->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a +
                             pOVar8->vi[lVar21]);
                  ON_3dPoint::ON_3dPoint
                            (&local_268,
                             (pOVar24->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a +
                             pOVar8->vi[uVar12]);
                  uVar23 = local_248;
                  pOVar9 = local_270;
                  this_00 = local_2a0;
                  if (local_2a0 != (ON_Xform *)0x0) {
                    ON_Xform::operator*(&local_1e0,local_2a0,&local_2c8);
                    local_2c8.z = local_1e0.z;
                    local_2c8.x = local_1e0.x;
                    local_2c8.y = local_1e0.y;
                    ON_Xform::operator*(&local_1e0,this_00,&local_268);
                    local_268.z = local_1e0.z;
                    local_268.x = local_1e0.x;
                    local_268.y = local_1e0.y;
                  }
                  ON_Interval::ON_Interval(&local_280,0.0,1.0);
                  uVar22 = 0;
                  uVar12 = local_22c;
                  do {
                    bVar10 = ON_Interval::operator!=(&local_280,&ON_Interval::EmptyInterval);
                    if (!bVar10) break;
                    if ((uVar2 >> (uVar12 & 0x1f) & 1) == 0) {
                      if (((uint)local_288 & 1 << ((byte)uVar12 & 0x1f)) != 0) {
                        P_05.y = local_2c8.y;
                        P_05.x = local_2c8.x;
                        P_05.z = local_2c8.z;
                        dVar3 = ON_PlaneEquation::ValueAt
                                          ((ON_PlaneEquation *)((long)&pOVar9->m_a->x + uVar22),P_05
                                          );
                        local_228._8_4_ = extraout_XMM0_Dc;
                        local_228._0_8_ = dVar3;
                        local_228._12_4_ = extraout_XMM0_Dd;
                        P_06.y = local_268.y;
                        P_06.x = local_268.x;
                        P_06.z = local_268.z;
                        dVar3 = ON_PlaneEquation::ValueAt
                                          ((ON_PlaneEquation *)((long)&pOVar9->m_a->x + uVar22),P_06
                                          );
                        ON_Interval::ON_Interval
                                  ((ON_Interval *)&local_1e0,0.0,
                                   -(double)local_228._0_8_ / (dVar3 - (double)local_228._0_8_));
                        ON_Interval::Intersection(&local_280,(ON_Interval *)&local_1e0);
                      }
                    }
                    else {
                      P_03.y = local_2c8.y;
                      P_03.x = local_2c8.x;
                      P_03.z = local_2c8.z;
                      dVar3 = ON_PlaneEquation::ValueAt
                                        ((ON_PlaneEquation *)((long)&pOVar9->m_a->x + uVar22),P_03);
                      local_228._0_8_ = dVar3;
                      P_04.y = local_268.y;
                      P_04.x = local_268.x;
                      P_04.z = local_268.z;
                      dVar3 = ON_PlaneEquation::ValueAt
                                        ((ON_PlaneEquation *)((long)&pOVar9->m_a->x + uVar22),P_04);
                      ON_Interval::ON_Interval
                                ((ON_Interval *)&local_1e0,
                                 (double)local_228._0_8_ / ((double)local_228._0_8_ - dVar3),1.0);
                      ON_Interval::Intersection(&local_280,(ON_Interval *)&local_1e0);
                    }
                    uVar12 = uVar12 - 1;
                    uVar22 = uVar22 + 0x20;
                  } while (uVar23 != uVar22);
                  bVar10 = ON_Interval::operator!=(&local_280,&ON_Interval::EmptyInterval);
                  if (bVar10) {
                    pdVar13 = ON_Interval::operator[](&local_280,0);
                    if (0.0 < *pdVar13) {
                      pdVar13 = ON_Interval::operator[](&local_280,0);
                      ::operator*(&local_1a8,1.0 - *pdVar13,&local_2c8);
                      pdVar13 = ON_Interval::operator[](&local_280,0);
                      ::operator*(&local_1c0,*pdVar13,&local_268);
                      ON_3dPoint::operator+(&local_1e0,&local_1a8,&local_1c0);
                      ON_BoundingBox::Set(&local_218,&local_1e0,1);
                    }
                    pdVar13 = ON_Interval::operator[](&local_280,1);
                    if (*pdVar13 <= 1.0 && *pdVar13 != 1.0) {
                      pdVar13 = ON_Interval::operator[](&local_280,1);
                      ::operator*(&local_1a8,1.0 - *pdVar13,&local_2c8);
                      pdVar13 = ON_Interval::operator[](&local_280,1);
                      ::operator*(&local_1c0,*pdVar13,&local_268);
                      ON_3dPoint::operator+(&local_1e0,&local_1a8,&local_1c0);
                      ON_BoundingBox::Set(&local_218,&local_1e0,1);
                    }
                  }
                }
              }
              local_2ec = (uint)local_288;
              uVar23 = local_2d0 & 0xffffffff;
              lVar25 = local_238;
              bVar27 = (byte)local_240;
            }
            lVar21 = lVar25;
          } while (lVar25 != 4);
          lVar21 = local_1c8 + 1;
        }
      }
      ON_BoundingBoxCache::AddBoundingBox(local_1e8,&local_218,&local_18c);
      bVar10 = ON_BoundingBox::IsNotEmpty(&local_218);
      if (bVar10) {
        if (local_2f4 == 0) {
          (pOVar18->m_max).y = local_218.m_max.y;
          (pOVar18->m_max).z = local_218.m_max.z;
          (pOVar18->m_min).z = local_218.m_min.z;
          (pOVar18->m_max).x = local_218.m_max.x;
          (pOVar18->m_min).x = (double)CONCAT44(local_218.m_min.x._4_4_,local_218.m_min.x._0_4_);
          (pOVar18->m_min).y = (double)CONCAT44(local_218.m_min.y._4_4_,local_218.m_min.y._0_4_);
        }
        else {
          ON_BoundingBox::Union(pOVar18,&local_218);
        }
      }
      bVar10 = ON_BoundingBox::IsNotEmpty(pOVar18);
      if ((vector<bool,_std::allocator<bool>_> *)
          local_178[0].super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p != (vector<bool,_std::allocator<bool>_> *)0x0) {
        operator_delete(local_178[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                        (long)local_178[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_end_of_storage -
                        (long)local_178[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      }
    }
  }
  return bVar10;
}

Assistant:

bool ON_Mesh::GetTightBoundingBox(
	ON_BoundingBox& Xtight_bbox,
	bool bGrowBox,
	const ON_SimpleArray<ON_PlaneEquation>& Clip,
	const ON_Xform* xform
) const
{
	if (bGrowBox && false == Xtight_bbox.IsNotEmpty() )
		bGrowBox = false;

	if (!bGrowBox)
		Xtight_bbox = ON_BoundingBox::EmptyBoundingBox;

	// Avoid applying the identity transformation repeatedly
	if (xform && xform->IsIdentity())
		xform = nullptr;

  if (Clip.Count() <= 0 && xform == nullptr)
    return (GetBBox(Xtight_bbox.m_min, Xtight_bbox.m_max, bGrowBox) ? true : false);

  // Dale Lear
  // Set hash = sha1 hash of information needed to get the tight bounding box.
  // This does not include a hash of mesh vertex locations. These cached
  // boxes are removed by ON_Mesh.InvalidateBoundingBoxes() so this hash
  // does not need to include vertex locations or face information.
  ON_SHA1 sha1;
  if (nullptr != xform)
    sha1.AccumulateTransformation(*xform);
  for (unsigned int i = 0; i < Clip.UnsignedCount(); i++)
  {
    sha1.AccumulateDoubleArray(4, &Clip[i].x);
  }
  const ON_SHA1_Hash hash = sha1.Hash();

  ON_BoundingBox bbox;

  if (m_tight_bbox_cache.GetBoundingBox(hash, bbox))
  {
    if (bGrowBox)
      Xtight_bbox.Union(bbox);
    else
      Xtight_bbox = bbox;
    return Xtight_bbox.IsNotEmpty();
  }

	// Perform clip test on cached bbox 
	if (xform == nullptr && m_vertex_bbox.IsNotEmpty())
	{
		ON_3dPoint Corner[8];
		m_vertex_bbox.GetCorners(Corner);

		bool AllIn = true;
		for( int i=0; AllIn && i<8; i++)
			for (int j = 0; AllIn && j < Clip.Count(); j++)
			{
				AllIn = (Clip[j].ValueAt(Corner[i]) <= 0.0);
			}

    if (AllIn)
    {
      bool rc = GetBBox(bbox.m_min, bbox.m_max, false) ? true : false;
      m_tight_bbox_cache.AddBoundingBox(bbox, hash);
      if (rc && bGrowBox)
        Xtight_bbox.Union(bbox);
      else
        Xtight_bbox = bbox;
      return Xtight_bbox.IsNotEmpty();
    }
	}

	// Now just add verticies of the clipped mesh
	int vcnt = VertexCount();

  // 16 Sept 2021, Mikko, RH-49510:
  // Bail out if the mesh is bogus. In the associated youtrack item
  // this fixes the bounding box of a block being way too big.
  if (vcnt < 3)
    return false;
	
	// n = number of clipping planes.  At most 32 clipping planes are allowed so that this function can use unsigned int
	// to represent the 32 clip predicates.
	int n = Clip.Count();
	if (n > 32)
		n = 32;
	int bits = (n > 1) ? n + 1 : n;
	int bpv = (n>0)?1<<int(ceil(log2(bits))) : 1;		// bits per vertex this is a power of 2
	std::vector<bool> ClipData(vcnt*bpv, false);  // ClipData[ vi*bpv ] is true if vertex vi is clipped out of the view
                                         // If n>1 then further information is provided by
																				//    ClipData[vi*bpv + j+ 1] is true if Clip[j](m_V[vi])>0 that is
																				//           vertex vi is clipped out by Clip[j]
	// Compute ClipData for each vertex
	for (int vi = 0; vi < vcnt; vi++)
	{
		ON_3dPoint P = m_V[vi];
		if (xform)
			P = (*xform)*P;

		bool clipped = false;
		if (n > 0)
		{
			int cdi0 = vi*bpv;
			clipped = Clip[0].ValueAt(P) > 0;

			if (n > 1)
			{
				int cdi1 = cdi0 + 1;
				ClipData[cdi1++] = clipped;
				for (int j = 1; j < n; j++)
				{
					bool out = Clip[j].ValueAt(P) > 0;
					ClipData[cdi1++] = out;
					clipped = clipped || out;
				}
			}
			ClipData[cdi0] = clipped;
		}
		// If the vertex is not clipped add it to the boundingbox
		if( !clipped)
			bbox.Set(P, true);
	}

	if (n > 0)
	{
		// Now process each mesh face and look for intersections with the clipping region boundary
		for (int fi = 0; fi < FaceCount(); fi++)
		{
			const ON_MeshFace& F = m_F[fi];
			unsigned int LastData=0;
			bool LastDataValid = false;
			bool LastOut = ClipData[F.vi[0] * bpv];
			if (LastOut)
			{
				GetClipData(F.vi[0], ClipData, &LastData, n, bpv);
				LastDataValid = true;
			}
			for (int fvi = 0; fvi < 4; fvi++)
			{
				if (fvi == 2 && F.vi[fvi] == F.vi[fvi + 1])
					continue;

				unsigned int NextData=0;
				bool NextDataValid=false;
				bool NextOut = ClipData[F.vi[(fvi + 1) % 4] * bpv];
				if (NextOut)
				{
					GetClipData(F.vi[(fvi + 1) % 4], ClipData, &NextData, n, bpv);
					NextDataValid = true;
				}

				if (LastOut || NextOut)
				{
					// Make sure *Data is Valid
					if (!LastDataValid)
					{
						GetClipData(F.vi[fvi], ClipData, &LastData, n, bpv);
						LastDataValid = true;
					}
					if (!NextDataValid)
					{
						GetClipData(F.vi[fvi], ClipData, &NextData, n, bpv);
						NextDataValid = true;
					}
				}
				if ((LastOut || NextOut) && (LastData & NextData) == 0)
				{
					// Is there a segment of this edge that is not clipped out
					ON_3dPoint Last = m_V[F.vi[fvi]];
					ON_3dPoint Next = m_V[F.vi[(fvi + 1) % 4]];
					if (xform)
					{
						Last = (*xform)*Last;
						Next = (*xform)*Next;
					}

					ON_Interval Dom(0.0, 1.0);  // Dom parameterizes the line segment from Last to Next
					for (int j = 0; j < n && Dom != ON_Interval::EmptyInterval; j++)
					{
						unsigned int mask = 1 << (n - 1 - j);
						if (mask & LastData)
						{
							double cplast = Clip[j].ValueAt(Last);		// out >0
							double cpnext = Clip[j].ValueAt(Next);		// in <0 
							ON_Interval D(cplast / (cplast - cpnext), 1.0);
							Dom.Intersection(D);
						}
						else if (mask & NextData)
						{
							double cplast = Clip[j].ValueAt(Last);
							double cpnext = Clip[j].ValueAt(Next);
							ON_Interval D(0.0, -cplast / (cpnext - cplast));
							Dom.Intersection(D);
						}
					}
					if (Dom != ON_Interval::EmptyInterval)
					{
						if (Dom[0] > 0.0)
						{
							ON_3dPoint Pt = (1 - Dom[0])*Last + Dom[0] * Next;
							bbox.Set(Pt, true);
						}
						if (Dom[1] < 1.0)
						{
							ON_3dPoint Pt = (1 - Dom[1])*Last + Dom[1] * Next;
							bbox.Set(Pt, true);
						}
					}
				}

				LastOut = NextOut;
				LastDataValid = NextDataValid;
				LastData = NextData;
			}
		}
	}

  m_tight_bbox_cache.AddBoundingBox(bbox, hash);
  if (bbox.IsNotEmpty())
  {
    if (bGrowBox)
      Xtight_bbox.Union(bbox);
    else
      Xtight_bbox = bbox;
  }

  return Xtight_bbox.IsNotEmpty();
}